

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O1

string * __thiscall
TransitionObservationIndependentMADPDiscrete::SoftPrintJointActionSet_abi_cxx11_
          (string *__return_storage_ptr__,TransitionObservationIndependentMADPDiscrete *this)

{
  pointer ppJVar1;
  char cVar2;
  undefined8 *puVar3;
  pointer ppJVar4;
  stringstream ss;
  stringstream str;
  long *local_340;
  long local_338;
  long local_330 [47];
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (this->_m_initialized != false) {
    ppJVar4 = (this->_m_jointActionVec).
              super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppJVar1 = (this->_m_jointActionVec).
              super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppJVar4 != ppJVar1) {
      do {
        (*((*ppJVar4)->super_JointAction)._vptr_JointAction[3])(&local_340);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)local_340,local_338);
        if (local_340 != local_330) {
          operator_delete(local_340,local_330[0] + 1);
        }
        cVar2 = (char)(ostream *)local_1a8;
        std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
        ppJVar4 = ppJVar4 + 1;
      } while (ppJVar4 != ppJVar1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_330,"TransitionObservationIndependentMADPDiscrete::PrintJoint",0x38);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_330,"ActionSets() - Error: not initialized. ",0x27);
  std::endl<char,std::char_traits<char>>((ostream *)local_330);
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar3 = &PTR__E_0059bd80;
  std::__cxx11::stringbuf::str();
  __cxa_throw(puVar3,&E::typeinfo,E::~E);
}

Assistant:

string TransitionObservationIndependentMADPDiscrete::SoftPrintJointActionSet() 
    const
{
    stringstream str;
    if(!_m_initialized)
    {
        stringstream ss;
            ss << "TransitionObservationIndependentMADPDiscrete::PrintJoint"<<
                "ActionSets() - Error: not initialized. "<<endl;
        throw E(ss);
    }   
    vector<JointActionDiscrete*>::const_iterator ja_it = 
        _m_jointActionVec.begin();
    vector<JointActionDiscrete*>::const_iterator ja_last = 
        _m_jointActionVec.end();
    while(ja_it != ja_last)
    {
        str << (*ja_it)->SoftPrint();
        str<<endl;
        ja_it++;    
    }
    return(str.str());
}